

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource::ParseFromArray
          (GetAsyncCommandResponse_StopDataSource *this,void *raw,size_t size)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong *puVar5;
  ulong uVar6;
  bool bVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong *in_R11;
  ulong *puVar15;
  bool bVar16;
  ulong local_58;
  Field local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar5 = (ulong *)(size + (long)raw);
  do {
    lVar3 = 7;
    if (puVar5 <= raw) goto LAB_002716a0;
    uVar10 = (ulong)(char)(byte)*raw;
    puVar15 = (ulong *)((long)raw + 1);
    if ((long)uVar10 < 0) {
      bVar1 = (byte)*raw;
      uVar2 = (ulong)(bVar1 & 0x7f);
      bVar7 = false;
      puVar8 = puVar15;
      for (; (uVar10 = uVar2, puVar11 = puVar8, (char)bVar1 < '\0' &&
             (bVar16 = 0x38 < lVar3 - 7U, bVar7 = bVar16 || puVar5 <= puVar8, uVar10 = 0,
             puVar11 = puVar15, !bVar16 && puVar5 > puVar8)); lVar3 = lVar3 + 7) {
        bVar1 = (byte)*puVar8;
        in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar3 & 0x3f));
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar2 = uVar2 | (ulong)in_R11;
      }
      puVar15 = puVar11;
      if (bVar7) {
        puVar15 = (ulong *)raw;
        uVar10 = 0;
      }
      if (puVar15 == (ulong *)raw) goto LAB_002716a0;
    }
    uVar4 = (uint)(uVar10 >> 3);
    if ((uVar4 == 0) || (puVar5 <= puVar15)) {
switchD_0027151a_caseD_3:
      bVar7 = false;
      uVar10 = 0;
      uVar2 = 0;
    }
    else {
      switch((uint)uVar10 & 7) {
      case 0:
        uVar9 = 0;
        bVar7 = puVar15 >= puVar5;
        if (puVar15 < puVar5) {
          puVar8 = (ulong *)((long)puVar15 + 1);
          bVar1 = (byte)*puVar15;
          uVar6 = (ulong)(bVar1 & 0x7f);
          uVar2 = 0;
          uVar13 = uVar6;
          if ((char)bVar1 < '\0') {
            uVar13 = 0;
          }
          uVar14 = (uint)uVar13;
          in_R11 = puVar8;
          if ((char)bVar1 < '\0') {
            uVar2 = 0;
            lVar3 = 7;
            puVar11 = puVar8;
            do {
              uVar14 = (uint)uVar13;
              bVar7 = 0x38 < lVar3 - 7U || puVar5 <= puVar11;
              in_R11 = puVar8;
              if (bVar7) break;
              bVar1 = (byte)*puVar11;
              in_R11 = (ulong *)((long)puVar11 + 1);
              uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar3 & 0x3f);
              lVar3 = lVar3 + 7;
              if ((char)bVar1 >= '\0') {
                uVar13 = uVar6 & 0xffffffff;
                uVar2 = uVar6 >> 0x20;
              }
              uVar14 = (uint)uVar13;
              puVar11 = in_R11;
            } while ((char)bVar1 < '\0');
          }
        }
        else {
          uVar2 = 0;
          uVar14 = 0;
        }
        if (bVar7) {
          uVar2 = 0;
          in_R11 = puVar15;
          uVar14 = 0;
        }
        if (in_R11 != puVar15) goto LAB_002716d3;
        uVar10 = 0;
        bVar7 = false;
        uVar2 = uVar9;
        goto LAB_00271714;
      case 1:
        in_R11 = puVar15 + 1;
        if (puVar5 < in_R11) {
LAB_002716a0:
          uVar10 = 0;
          bVar7 = false;
          uVar2 = 0;
          goto LAB_00271714;
        }
        uVar9 = *puVar15;
        uVar2 = uVar9 >> 0x20;
        break;
      case 2:
        bVar7 = puVar15 >= puVar5;
        uVar9 = local_58;
        if (puVar15 < puVar5) {
          puVar8 = (ulong *)((long)puVar15 + 1);
          uVar2 = (ulong)((byte)*puVar15 & 0x7f);
          in_R11 = puVar8;
          uVar9 = uVar2;
          if ((char)(byte)*puVar15 < '\0') {
            lVar3 = 7;
            puVar11 = puVar8;
            do {
              bVar7 = 0x38 < lVar3 - 7U || puVar5 <= puVar11;
              in_R11 = puVar8;
              uVar9 = local_58;
              if (bVar7) break;
              uVar13 = *puVar11;
              puVar11 = (ulong *)((long)puVar11 + 1);
              uVar2 = uVar2 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar3 & 0x3f);
              lVar3 = lVar3 + 7;
              in_R11 = puVar11;
              uVar9 = uVar2;
            } while ((char)(byte)uVar13 < '\0');
          }
        }
        uVar2 = 0;
        local_58 = uVar9;
        if (bVar7) {
          in_R11 = puVar15;
          local_58 = uVar2;
        }
        if (in_R11 == puVar15) {
          uVar14 = 0;
          bVar7 = false;
          uVar9 = 0;
        }
        else if ((ulong)((long)puVar5 - (long)in_R11) < local_58) {
          uVar2 = 0;
          uVar14 = 0;
          bVar7 = false;
          uVar9 = 0;
        }
        else {
          uVar2 = (ulong)in_R11 >> 0x20;
          uVar14 = (uint)in_R11;
          in_R11 = (ulong *)((long)in_R11 + local_58);
          bVar7 = true;
          uVar9 = local_58;
        }
        if (!bVar7) goto LAB_002716a0;
        goto LAB_002716d3;
      default:
        goto switchD_0027151a_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar15 + 4);
        uVar2 = 0;
        if (puVar5 < in_R11) goto LAB_002716a0;
        uVar9 = (ulong)(uint)*puVar15;
      }
      uVar14 = (uint)uVar9;
      uVar9 = 0;
LAB_002716d3:
      bVar7 = true;
      raw = in_R11;
      if ((uVar4 < 0x10000) && (uVar9 < 0x10000000)) {
        uVar2 = (ulong)uVar14 | uVar2 << 0x20;
        uVar10 = uVar9 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
        bVar7 = false;
      }
      else {
        uVar2 = 0;
        uVar10 = 0;
      }
    }
LAB_00271714:
    puVar15 = (ulong *)0x7;
    local_48.int_value_ = uVar2;
    if (!bVar7) {
      do {
        local_48.size_ = (uint32_t)uVar10;
        local_48.type_ = (uint8_t)(uVar10 >> 0x30);
        local_48.id_ = (uint16_t)(uVar10 >> 0x20);
        if (local_48.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          this->instance_id_ = local_48.int_value_;
        }
        else {
          if (local_48.id_ == 0) {
            return puVar5 == (ulong *)raw;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_48,local_38);
        }
        do {
          if (puVar5 <= raw) goto LAB_002718ab;
          uVar10 = (ulong)(char)(byte)*raw;
          puVar8 = (ulong *)((long)raw + 1);
          if ((long)uVar10 < 0) {
            uVar10 = (ulong)((byte)*raw & 0x7f);
            bVar7 = false;
            puVar11 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar3 = 7;
              uVar9 = uVar10;
              puVar12 = puVar8;
              do {
                bVar7 = 0x38 < lVar3 - 7U || puVar5 <= puVar12;
                uVar10 = 0;
                puVar11 = puVar8;
                if (bVar7) break;
                uVar13 = *puVar12;
                puVar11 = (ulong *)((long)puVar12 + 1);
                uVar10 = uVar9 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar3 & 0x3f);
                lVar3 = lVar3 + 7;
                uVar9 = uVar10;
                puVar12 = puVar11;
              } while ((char)(byte)uVar13 < '\0');
            }
            puVar8 = puVar11;
            if (bVar7) {
              puVar8 = (ulong *)raw;
              uVar10 = 0;
            }
            if (puVar8 == (ulong *)raw) goto LAB_002718ab;
          }
          uVar4 = (uint)(uVar10 >> 3);
          if ((uVar4 == 0) || (puVar5 <= puVar8)) {
switchD_00271933_caseD_3:
            local_48.int_value_ = 0;
            bVar7 = false;
            uVar10 = 0;
            goto LAB_00271b23;
          }
          switch((uint)uVar10 & 7) {
          case 0:
            local_48.int_value_ = 0;
            bVar7 = puVar8 >= puVar5;
            if (puVar8 < puVar5) {
              puVar11 = (ulong *)((long)puVar8 + 1);
              uVar14 = (byte)*puVar8 & 0x7f;
              uVar9 = (ulong)uVar14;
              uVar13 = (ulong)uVar14;
              puVar15 = puVar11;
              uVar14 = 0;
              if ((char)(byte)*puVar8 < '\0') {
                uVar13 = 0;
                lVar3 = 7;
                puVar12 = puVar11;
                do {
                  bVar16 = 0x38 < lVar3 - 7U;
                  bVar7 = bVar16 || puVar5 <= puVar12;
                  puVar15 = puVar11;
                  uVar14 = 0;
                  if (bVar16 || puVar5 <= puVar12) break;
                  bVar1 = (byte)*puVar12;
                  puVar12 = (ulong *)((long)puVar12 + 1);
                  uVar9 = uVar9 | (ulong)(bVar1 & 0x7f) << ((byte)lVar3 & 0x3f);
                  lVar3 = lVar3 + 7;
                  if (-1 < (char)bVar1) {
                    uVar13 = uVar9 & 0xffffffff;
                  }
                  puVar15 = puVar12;
                  uVar14 = (uint)(uVar9 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar13 = 0;
              uVar14 = 0;
            }
            if (bVar7) {
              uVar13 = local_48.int_value_;
            }
            uVar9 = (ulong)uVar14;
            if (bVar7) {
              puVar15 = puVar8;
              uVar9 = local_48.int_value_;
            }
            uVar6 = local_48.int_value_;
            if (puVar15 == puVar8) {
              uVar10 = 0;
              bVar7 = false;
            }
            else {
LAB_00271ae2:
              bVar7 = true;
              raw = puVar15;
              if ((uVar4 < 0x10000) && (uVar6 < 0x10000000)) {
                local_48.int_value_ = uVar13 & 0xffffffff | uVar9 << 0x20;
                uVar10 = uVar6 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
                bVar7 = false;
              }
              else {
                local_48.int_value_ = 0;
                uVar10 = 0;
              }
            }
            break;
          case 1:
            puVar15 = puVar8 + 1;
            if (puVar15 <= puVar5) {
              uVar13 = *puVar8;
              uVar9 = uVar13 >> 0x20;
LAB_00271994:
              uVar6 = 0;
              goto LAB_00271ae2;
            }
            goto LAB_002718ab;
          case 2:
            bVar7 = puVar8 >= puVar5;
            uVar9 = uVar2;
            if (puVar8 < puVar5) {
              puVar11 = (ulong *)((long)puVar8 + 1);
              uVar13 = (ulong)((byte)*puVar8 & 0x7f);
              puVar15 = puVar11;
              uVar9 = uVar13;
              if ((char)(byte)*puVar8 < '\0') {
                lVar3 = 7;
                puVar12 = puVar11;
                do {
                  bVar7 = 0x38 < lVar3 - 7U || puVar5 <= puVar12;
                  puVar15 = puVar11;
                  uVar9 = uVar2;
                  if (bVar7) break;
                  uVar6 = *puVar12;
                  puVar12 = (ulong *)((long)puVar12 + 1);
                  uVar13 = uVar13 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar3 & 0x3f);
                  lVar3 = lVar3 + 7;
                  puVar15 = puVar12;
                  uVar9 = uVar13;
                } while ((char)(byte)uVar6 < '\0');
              }
            }
            uVar2 = uVar9;
            if (bVar7) {
              puVar15 = puVar8;
              uVar2 = 0;
            }
            if ((puVar15 == puVar8) || ((ulong)((long)puVar5 - (long)puVar15) < uVar2)) {
              uVar13 = 0;
              uVar9 = 0;
              bVar7 = false;
              uVar6 = 0;
            }
            else {
              uVar9 = (ulong)puVar15 >> 0x20;
              uVar13 = (ulong)puVar15 & 0xffffffff;
              puVar15 = (ulong *)((long)puVar15 + uVar2);
              bVar7 = true;
              uVar6 = uVar2;
            }
            if (bVar7) goto LAB_00271ae2;
            local_48.int_value_ = 0;
            uVar10 = 0;
            bVar7 = false;
            break;
          default:
            goto switchD_00271933_caseD_3;
          case 5:
            puVar15 = (ulong *)((long)puVar8 + 4);
            uVar9 = 0;
            if (puVar15 <= puVar5) {
              uVar13 = (ulong)(uint)*puVar8;
              goto LAB_00271994;
            }
LAB_002718ab:
            local_48.int_value_ = 0;
            uVar10 = 0;
            bVar7 = false;
          }
LAB_00271b23:
        } while (bVar7);
      } while( true );
    }
  } while( true );
}

Assistant:

bool GetAsyncCommandResponse_StopDataSource::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* instance_id */:
        field.get(&instance_id_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}